

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# neural_network.cpp
# Opt level: O2

void __thiscall NeuralNetwork::backPropagation(NeuralNetwork *this,VectorXf *y)

{
  pointer pLVar1;
  uint uVar2;
  VectorXf temp;
  VectorXf temp1;
  void *local_120 [2];
  int local_10c;
  VectorXf *local_108;
  _func_float_float *local_100;
  Product<Eigen::Transpose<Eigen::Matrix<float,__1,__1,_0,__1,__1>_>,_Eigen::Matrix<float,__1,_1,_0,__1,_1>,_0>
  local_f8;
  long lStack_e8;
  float local_dc;
  XprTypeNested local_d0;
  _func_float_float *p_Stack_c8;
  CwiseBinaryOp<Eigen::internal::scalar_product_op<float,_float>,_const_Eigen::Matrix<float,__1,_1,_0,__1,_1>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,_const_Eigen::Matrix<float,__1,_1,_0,__1,_1>_>_>
  local_b0;
  MatrixXf *local_90 [2];
  variable_if_dynamic<long,__1> vStack_80;
  scalar_constant_op<float> local_74;
  XprTypeNested local_68;
  _func_float_float *p_Stack_60;
  VectorXf *local_50;
  _func_float_float *p_Stack_48;
  float local_3c;
  
  Eigen::MatrixBase<Eigen::Matrix<float,-1,1,0,-1,1>>::operator-
            ((CwiseBinaryOp<Eigen::internal::scalar_difference_op<float,_float>,_const_Eigen::Matrix<float,__1,_1,_0,__1,_1>,_const_Eigen::Matrix<float,__1,_1,_0,__1,_1>_>
              *)&local_f8,(MatrixBase<Eigen::Matrix<float,_1,1,0,_1,1>> *)y,
             (MatrixBase<Eigen::Matrix<float,__1,_1,_0,__1,_1>_> *)
             &(this->layers_).super__Vector_base<Layer,_std::allocator<Layer>_>._M_impl.
              super__Vector_impl_data._M_finish[-1].output);
  Eigen::internal::
  call_assignment<Eigen::Matrix<float,_1,1,0,_1,1>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<float,float>,Eigen::Matrix<float,_1,1,0,_1,1>const,Eigen::Matrix<float,_1,1,0,_1,1>const>>
            (&(this->layers_).super__Vector_base<Layer,_std::allocator<Layer>_>._M_impl.
              super__Vector_impl_data._M_finish[-1].loss,
             (CwiseBinaryOp<Eigen::internal::scalar_difference_op<float,_float>,_const_Eigen::Matrix<float,__1,_1,_0,__1,_1>,_const_Eigen::Matrix<float,__1,_1,_0,__1,_1>_>
              *)&local_f8);
  pLVar1 = (this->layers_).super__Vector_base<Layer,_std::allocator<Layer>_>._M_impl.
           super__Vector_impl_data._M_finish;
  local_10c = -2;
  Eigen::MatrixBase<Eigen::Matrix<float,-1,1,0,-1,1>>::operator*
            (&local_b0,(MatrixBase<Eigen::Matrix<float,_1,1,0,_1,1>> *)&pLVar1[-1].loss,&local_10c);
  local_50 = local_b0.m_lhs;
  p_Stack_48 = (_func_float_float *)local_b0.m_rhs.m_rows.m_value;
  local_3c = local_b0.m_rhs.m_functor.m_other;
  local_100 = this->deriveActivateFunc_;
  local_108 = &pLVar1[-1].output;
  Eigen::
  ArrayBase<Eigen::ArrayWrapper<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float,float>,Eigen::Matrix<float,-1,1,0,-1,1>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,Eigen::Matrix<float,-1,1,0,-1,1>const>const>const>>
  ::operator*((CwiseBinaryOp<Eigen::internal::scalar_product_op<float,_float>,_const_Eigen::ArrayWrapper<const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float,_float>,_const_Eigen::Matrix<float,__1,_1,_0,__1,_1>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,_const_Eigen::Matrix<float,__1,_1,_0,__1,_1>_>_>_>,_const_Eigen::ArrayWrapper<const_Eigen::CwiseUnaryOp<float_(*)(float),_const_Eigen::Matrix<float,__1,_1,_0,__1,_1>_>_>_>
               *)local_90,
              (ArrayBase<Eigen::ArrayWrapper<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float,float>,Eigen::Matrix<float,_1,1,0,_1,1>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,Eigen::Matrix<float,_1,1,0,_1,1>const>const>const>>
               *)&local_50,
              (ArrayBase<Eigen::ArrayWrapper<const_Eigen::CwiseUnaryOp<float_(*)(float),_const_Eigen::Matrix<float,__1,_1,_0,__1,_1>_>_>_>
               *)&local_108);
  lStack_e8 = vStack_80.m_value;
  local_dc = local_74.m_other;
  local_d0 = local_68;
  p_Stack_c8 = p_Stack_60;
  Eigen::PlainObjectBase<Eigen::Matrix<float,-1,1,0,-1,1>>::
  PlainObjectBase<Eigen::MatrixWrapper<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float,float>,Eigen::ArrayWrapper<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float,float>,Eigen::Matrix<float,_1,1,0,_1,1>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,Eigen::Matrix<float,_1,1,0,_1,1>const>const>const>const,Eigen::ArrayWrapper<Eigen::CwiseUnaryOp<float(*)(float),Eigen::Matrix<float,_1,1,0,_1,1>const>const>const>const>>
            ((PlainObjectBase<Eigen::Matrix<float,_1,1,0,_1,1>> *)local_120,
             (DenseBase<Eigen::MatrixWrapper<const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float,_float>,_const_Eigen::ArrayWrapper<const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float,_float>,_const_Eigen::Matrix<float,__1,_1,_0,__1,_1>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,_const_Eigen::Matrix<float,__1,_1,_0,__1,_1>_>_>_>,_const_Eigen::ArrayWrapper<const_Eigen::CwiseUnaryOp<float_(*)(float),_const_Eigen::Matrix<float,__1,_1,_0,__1,_1>_>_>_>_>_>
              *)&local_f8);
  Eigen::internal::
  call_assignment<Eigen::Matrix<float,_1,1,0,_1,1>,Eigen::Matrix<float,_1,1,0,_1,1>>
            (&(this->layers_).super__Vector_base<Layer,_std::allocator<Layer>_>._M_impl.
              super__Vector_impl_data._M_finish[-1].biasGrads,
             (Matrix<float,__1,_1,_0,__1,_1> *)local_120);
  pLVar1 = (this->layers_).super__Vector_base<Layer,_std::allocator<Layer>_>._M_impl.
           super__Vector_impl_data._M_start;
  local_f8.m_rhs = &pLVar1[(long)this->layerCount_ + -2].output;
  local_f8.m_lhs.m_matrix = (non_const_type)local_120;
  Eigen::internal::
  call_assignment<Eigen::Matrix<float,_1,_1,0,_1,_1>,Eigen::Product<Eigen::Matrix<float,_1,1,0,_1,1>,Eigen::Transpose<Eigen::Matrix<float,_1,1,0,_1,1>>,0>>
            (&pLVar1[(long)this->layerCount_ + -2].weightGrads,
             (Product<Eigen::Matrix<float,__1,_1,_0,__1,_1>,_Eigen::Transpose<Eigen::Matrix<float,__1,_1,_0,__1,_1>_>,_0>
              *)&local_f8);
  local_90[0] = &(this->layers_).super__Vector_base<Layer,_std::allocator<Layer>_>._M_impl.
                 super__Vector_impl_data._M_start[(long)this->layerCount_ + -2].weights;
  local_f8 = Eigen::MatrixBase<Eigen::Transpose<Eigen::Matrix<float,-1,-1,0,-1,-1>>>::operator*
                       ((MatrixBase<Eigen::Transpose<Eigen::Matrix<float,_1,_1,0,_1,_1>>> *)local_90
                        ,(MatrixBase<Eigen::Matrix<float,__1,_1,_0,__1,_1>_> *)local_120);
  Eigen::internal::
  call_assignment<Eigen::Matrix<float,_1,1,0,_1,1>,Eigen::Product<Eigen::Transpose<Eigen::Matrix<float,_1,_1,0,_1,_1>>,Eigen::Matrix<float,_1,1,0,_1,1>,0>>
            (&(this->layers_).super__Vector_base<Layer,_std::allocator<Layer>_>._M_impl.
              super__Vector_impl_data._M_start[(long)this->layerCount_ + -2].loss,&local_f8);
  uVar2 = this->layerCount_ - 3;
  while (-1 < (int)uVar2) {
    pLVar1 = (this->layers_).super__Vector_base<Layer,_std::allocator<Layer>_>._M_impl.
             super__Vector_impl_data._M_start;
    local_108 = &pLVar1[(ulong)uVar2 + 1].loss;
    local_b0.m_lhs = &pLVar1[(ulong)uVar2 + 1].output;
    local_b0.m_rhs.m_rows.m_value = (long)this->deriveActivateFunc_;
    Eigen::ArrayBase<Eigen::ArrayWrapper<Eigen::Matrix<float,-1,1,0,-1,1>>>::operator*
              ((CwiseBinaryOp<Eigen::internal::scalar_product_op<float,_float>,_const_Eigen::ArrayWrapper<Eigen::Matrix<float,__1,_1,_0,__1,_1>_>,_const_Eigen::ArrayWrapper<const_Eigen::CwiseUnaryOp<float_(*)(float),_const_Eigen::Matrix<float,__1,_1,_0,__1,_1>_>_>_>
                *)local_90,
               (ArrayBase<Eigen::ArrayWrapper<Eigen::Matrix<float,_1,1,0,_1,1>>> *)&local_108,
               (ArrayBase<Eigen::ArrayWrapper<const_Eigen::CwiseUnaryOp<float_(*)(float),_const_Eigen::Matrix<float,__1,_1,_0,__1,_1>_>_>_>
                *)&local_b0);
    lStack_e8 = vStack_80.m_value;
    local_f8.m_lhs.m_matrix = local_90[0];
    Eigen::PlainObjectBase<Eigen::Matrix<float,-1,1,0,-1,1>>::
    PlainObjectBase<Eigen::MatrixWrapper<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float,float>,Eigen::ArrayWrapper<Eigen::Matrix<float,_1,1,0,_1,1>>const,Eigen::ArrayWrapper<Eigen::CwiseUnaryOp<float(*)(float),Eigen::Matrix<float,_1,1,0,_1,1>const>const>const>const>>
              ((PlainObjectBase<Eigen::Matrix<float,_1,1,0,_1,1>> *)&local_50,
               (DenseBase<Eigen::MatrixWrapper<const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float,_float>,_const_Eigen::ArrayWrapper<Eigen::Matrix<float,__1,_1,_0,__1,_1>_>,_const_Eigen::ArrayWrapper<const_Eigen::CwiseUnaryOp<float_(*)(float),_const_Eigen::Matrix<float,__1,_1,_0,__1,_1>_>_>_>_>_>
                *)&local_f8);
    Eigen::internal::
    call_assignment<Eigen::Matrix<float,_1,1,0,_1,1>,Eigen::Matrix<float,_1,1,0,_1,1>>
              (&pLVar1[(ulong)uVar2 + 1].biasGrads,(Matrix<float,__1,_1,_0,__1,_1> *)&local_50);
    local_f8.m_rhs = &pLVar1[uVar2].output;
    local_f8.m_lhs.m_matrix = (non_const_type)&local_50;
    Eigen::internal::
    call_assignment<Eigen::Matrix<float,_1,_1,0,_1,_1>,Eigen::Product<Eigen::Matrix<float,_1,1,0,_1,1>,Eigen::Transpose<Eigen::Matrix<float,_1,1,0,_1,1>>,0>>
              (&pLVar1[uVar2].weightGrads,
               (Product<Eigen::Matrix<float,__1,_1,_0,__1,_1>,_Eigen::Transpose<Eigen::Matrix<float,__1,_1,_0,__1,_1>_>,_0>
                *)&local_f8);
    if (uVar2 != 0) {
      local_90[0] = &pLVar1[uVar2].weights;
      local_f8 = Eigen::MatrixBase<Eigen::Transpose<Eigen::Matrix<float,-1,-1,0,-1,-1>>>::operator*
                           ((MatrixBase<Eigen::Transpose<Eigen::Matrix<float,_1,_1,0,_1,_1>>> *)
                            local_90,(MatrixBase<Eigen::Matrix<float,__1,_1,_0,__1,_1>_> *)&local_50
                           );
      Eigen::internal::
      call_assignment<Eigen::Matrix<float,_1,1,0,_1,1>,Eigen::Product<Eigen::Transpose<Eigen::Matrix<float,_1,_1,0,_1,_1>>,Eigen::Matrix<float,_1,1,0,_1,1>,0>>
                (&pLVar1[uVar2].loss,&local_f8);
    }
    free(local_50);
    uVar2 = uVar2 - 1;
  }
  free(local_120[0]);
  return;
}

Assistant:

void NeuralNetwork::backPropagation(const Eigen::VectorXf& y) {
    using namespace std;
    using namespace Eigen;
    this->layers_.back().loss = (y - this->layers_.back().output);
    VectorXf& lastOutput = this->layers_.back().output;  //输出层的输出
    // temp就是损失对输出层偏置的梯度，同时，在求损失对权重的偏导，和损失对上一层输出的偏导时，也要乘以这个
    Eigen::VectorXf temp = ((this->layers_.back().loss * (-2)).array() *
                            (lastOutput.unaryExpr(this->deriveActivateFunc_).array()))
                               .matrix();
    // cout << temp.rows() << endl;

    this->layers_.back().biasGrads = temp;
    this->layers_[layerCount_ - 2].weightGrads =
        temp * (this->layers_[layerCount_ - 2].output.transpose());
    this->layers_[layerCount_ - 2].loss = this->layers_[layerCount_ - 2].weights.transpose() * temp;
    for (int i = layerCount_ - 3; i >= 0; --i) {
        auto& layer = this->layers_[i];
        auto& nextLayer = this->layers_[i + 1];
        Eigen::VectorXf temp1 = ((nextLayer.loss).array() *
                                 (nextLayer.output.unaryExpr(this->deriveActivateFunc_).array()))
                                    .matrix();
        nextLayer.biasGrads = temp1;
        layer.weightGrads = temp1 * (layer.output.transpose());
        if (i != 0)
            layer.loss = layer.weights.transpose() * temp1;
    }
}